

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backpack.cpp
# Opt level: O0

void __thiscall Backpack::~Backpack(Backpack *this)

{
  bool bVar1;
  reference ppBVar2;
  BackpackEntry *i;
  iterator __end1;
  iterator __begin1;
  vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_> *__range1;
  Backpack *this_local;
  
  (this->super_BackpackEntry)._vptr_BackpackEntry = (_func_int **)&PTR__Backpack_00135ba8;
  __end1 = std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::begin(&this->backpack);
  i = (BackpackEntry *)
      std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::end(&this->backpack);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppBVar2 = __gnu_cxx::
              __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
              ::operator*(&__end1);
    if (*ppBVar2 != (BackpackEntry *)0x0) {
      (*(*ppBVar2)->_vptr_BackpackEntry[1])();
    }
    __gnu_cxx::
    __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::~vector(&this->backpack);
  BackpackEntry::~BackpackEntry(&this->super_BackpackEntry);
  return;
}

Assistant:

Backpack::~Backpack() {
    for (auto i : backpack) {
        delete i;
    }
}